

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O1

idx_t duckdb::TernaryExecutor::
      SelectLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::UpperInclusiveBetweenOperator,false,false,true>
                (uhugeint_t *adata,uhugeint_t *bdata,uhugeint_t *cdata,SelectionVector *result_sel,
                idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uhugeint_t local_68;
  uhugeint_t local_58;
  uhugeint_t local_48;
  
  if (count == 0) {
    lVar5 = 0;
  }
  else {
    lVar5 = 0;
    uVar6 = 0;
    do {
      uVar8 = uVar6;
      if (result_sel->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)result_sel->sel_vector[uVar6];
      }
      uVar4 = uVar6;
      if (asel->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)asel->sel_vector[uVar6];
      }
      uVar7 = uVar6;
      if (bsel->sel_vector != (sel_t *)0x0) {
        uVar7 = (ulong)bsel->sel_vector[uVar6];
      }
      uVar3 = uVar6;
      if (csel->sel_vector != (sel_t *)0x0) {
        uVar3 = (ulong)csel->sel_vector[uVar6];
      }
      puVar1 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((((puVar1 == (unsigned_long *)0x0) || ((puVar1[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0))
          && ((puVar1 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
              puVar1 == (unsigned_long *)0x0 || ((puVar1[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0))))
         && ((puVar1 = (cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
             puVar1 == (unsigned_long *)0x0 || ((puVar1[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0))))
      {
        local_68.lower = adata[uVar4].lower;
        local_68.upper = adata[uVar4].upper;
        local_48.lower = bdata[uVar7].lower;
        local_48.upper = bdata[uVar7].upper;
        local_58.lower = cdata[uVar3].lower;
        local_58.upper = cdata[uVar3].upper;
        bVar2 = uhugeint_t::operator>(&local_68,&local_48);
        uVar4 = 1;
        if (bVar2) {
          bVar2 = uhugeint_t::operator>(&local_68,&local_58);
          uVar4 = (ulong)bVar2;
        }
      }
      else {
        uVar4 = 1;
      }
      false_sel->sel_vector[lVar5] = (sel_t)uVar8;
      lVar5 = uVar4 + lVar5;
      uVar6 = uVar6 + 1;
    } while (count != uVar6);
  }
  return count - lVar5;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}